

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendEquationAdvancedCase::iterate
          (BlendEquationAdvancedCase *this)

{
  GLenum *pGVar1;
  GLenum *pGVar2;
  TestLog *pTVar3;
  int iVar4;
  GLenum err;
  undefined4 extraout_var;
  int ndx;
  GLuint buf;
  undefined4 *puVar5;
  undefined4 *puVar6;
  ulong uVar7;
  ulong uVar8;
  allocator<char> local_e6;
  allocator<char> local_e5;
  deInt32 maxDrawBuffers;
  ScopedLogSection section;
  CallLogWrapper gl;
  string local_c0;
  string local_a0;
  ResultCollector result;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&gl,(Functions *)CONCAT44(extraout_var,iVar4),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0," // ERROR: ",(allocator<char> *)&local_a0);
  tcu::ResultCollector::ResultCollector(&result,pTVar3,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  maxDrawBuffers = 0;
  gl.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&gl,0x8824,&maxDrawBuffers);
  err = glu::CallLogWrapper::glGetError(&gl);
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x575);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterSettingCommon",&local_e5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After setting common",&local_e6);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar3,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  glu::CallLogWrapper::glBlendEquation(&gl,0x9295);
  for (iVar4 = 0; iVar4 < maxDrawBuffers; iVar4 = iVar4 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x8009,iVar4,0x9295,this->m_verifierType);
  }
  for (iVar4 = 0; iVar4 < maxDrawBuffers; iVar4 = iVar4 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x883d,iVar4,0x9295,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterSettingIndexed",&local_e5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After setting indexed",&local_e6);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar3,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  puVar5 = &DAT_018ae8b0;
  uVar7 = 0;
  while( true ) {
    if (maxDrawBuffers <= (int)(GLuint)uVar7) break;
    glu::CallLogWrapper::glBlendEquationi(&gl,(GLuint)uVar7,puVar5[(uVar7 / 0xf) * -0xf]);
    uVar7 = uVar7 + 1;
    puVar5 = puVar5 + 1;
  }
  puVar5 = &DAT_018ae8b0;
  uVar7 = 0;
  while( true ) {
    if (maxDrawBuffers <= (int)uVar7) break;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x8009,(int)uVar7,puVar5[(uVar7 / 0xf) * -0xf],this->m_verifierType);
    uVar7 = uVar7 + 1;
    puVar5 = puVar5 + 1;
  }
  puVar5 = &DAT_018ae8b0;
  uVar7 = 0;
  while( true ) {
    if (maxDrawBuffers <= (int)uVar7) break;
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x883d,(int)uVar7,puVar5[(uVar7 / 0xf) * -0xf],this->m_verifierType);
    uVar7 = uVar7 + 1;
    puVar5 = puVar5 + 1;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterResettingIndexedWithCommon",&local_e5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After resetting indexed with common",&local_e6);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar3,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  puVar5 = &DAT_018ae8b0;
  uVar7 = 0;
  while( true ) {
    if (maxDrawBuffers <= (int)(GLuint)uVar7) break;
    glu::CallLogWrapper::glBlendEquationi(&gl,(GLuint)uVar7,puVar5[(uVar7 / 0xf) * -0xf]);
    uVar7 = uVar7 + 1;
    puVar5 = puVar5 + 1;
  }
  glu::CallLogWrapper::glBlendEquation(&gl,0x9294);
  for (iVar4 = 0; iVar4 < maxDrawBuffers; iVar4 = iVar4 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x8009,iVar4,0x9294,this->m_verifierType);
  }
  for (iVar4 = 0; iVar4 < maxDrawBuffers; iVar4 = iVar4 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x883d,iVar4,0x9294,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar3 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"AfterResettingIndexedSeparateWithCommon",&local_e5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"After resetting indexed separate with common",&local_e6);
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar3,&local_c0,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  puVar5 = &DAT_018ae890;
  puVar6 = &DAT_018ae894;
  uVar7 = 1;
  uVar8 = 0;
  while( true ) {
    buf = (GLuint)uVar8;
    if (maxDrawBuffers <= (int)buf) break;
    pGVar1 = puVar5 + (uVar8 / 5) * -5;
    uVar8 = uVar8 + 1;
    pGVar2 = puVar6 + (uVar7 / 5) * -5;
    puVar5 = puVar5 + 1;
    puVar6 = puVar6 + 1;
    uVar7 = uVar7 + 1;
    glu::CallLogWrapper::glBlendEquationSeparatei(&gl,buf,*pGVar1,*pGVar2);
  }
  glu::CallLogWrapper::glBlendEquation(&gl,0x9298);
  for (iVar4 = 0; iVar4 < maxDrawBuffers; iVar4 = iVar4 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x8009,iVar4,0x9298,this->m_verifierType);
  }
  for (iVar4 = 0; iVar4 < maxDrawBuffers; iVar4 = iVar4 + 1) {
    deqp::gls::StateQueryUtil::verifyStateIndexedInteger
              (&result,&gl,0x883d,iVar4,0x9298,this->m_verifierType);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  tcu::ResultCollector::setTestContextResult
            (&result,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector(&result);
  glu::CallLogWrapper::~CallLogWrapper(&gl);
  return STOP;
}

Assistant:

BlendEquationAdvancedCase::IterateResult BlendEquationAdvancedCase::iterate (void)
{
	const deUint32 blendEquations[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
		GL_MIN,
		GL_MAX
	};

	const deUint32 blendEquationAdvanced[] =
	{
		GL_MULTIPLY,
		GL_SCREEN,
		GL_OVERLAY,
		GL_DARKEN,
		GL_LIGHTEN,
		GL_COLORDODGE,
		GL_COLORBURN,
		GL_HARDLIGHT,
		GL_SOFTLIGHT,
		GL_DIFFERENCE,
		GL_EXCLUSION,
		GL_HSL_HUE,
		GL_HSL_SATURATION,
		GL_HSL_COLOR,
		GL_HSL_LUMINOSITY
	};

	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result			(m_testCtx.getLog(), " // ERROR: ");
	deInt32					maxDrawBuffers = 0;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommon", "After setting common");

		gl.glBlendEquation(GL_SCREEN);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_SCREEN, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_SCREEN, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexed", "After setting indexed");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationi(ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)], m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommon", "After resetting indexed with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationi(ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)]);

		gl.glBlendEquation(GL_MULTIPLY);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_MULTIPLY, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_MULTIPLY, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedSeparateWithCommon", "After resetting indexed separate with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationSeparatei(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], blendEquations[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendEquations)]);

		gl.glBlendEquation(GL_LIGHTEN);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_LIGHTEN, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_LIGHTEN, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}